

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaB_newproxy(lua_State *L)

{
  StkId pTVar1;
  StkId pTVar2;
  GCObject *pGVar3;
  global_State *pgVar4;
  int iVar5;
  TValue *pTVar6;
  TValue *pTVar7;
  int nrec;
  StkId pTVar8;
  StkId pTVar9;
  TValue *o2;
  bool bVar10;
  
  pTVar1 = L->base;
  pTVar2 = pTVar1 + 1;
  pTVar8 = L->top;
  if (L->top < pTVar2) {
    do {
      pTVar8->tt = 0;
      pTVar9 = pTVar8 + 1;
      bVar10 = pTVar8 < pTVar1;
      pTVar8 = pTVar9;
    } while (bVar10);
    L->top = pTVar9;
  }
  L->top = pTVar2;
  iVar5 = 0;
  lua_newuserdata(L,0);
  pTVar6 = L->base;
  if (L->top <= pTVar6) {
    pTVar6 = &luaO_nilobject_;
  }
  if (pTVar6->tt != 0) {
    if (pTVar6->tt == 1) {
      if ((pTVar6->value).b == 0) {
        return 1;
      }
      lua_createtable(L,0,nrec);
      pTVar2 = L->top;
      pTVar2->value = pTVar2[-1].value;
      pTVar2->tt = pTVar2[-1].tt;
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2[1].value.b = 1;
      pTVar2[1].tt = 1;
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pGVar3 = (L->ci->func->value).gc;
      pTVar6 = (TValue *)&(pGVar3->h).lastfree;
      if ((pGVar3->h).lsizenode == '\0') {
        pTVar6 = &luaO_nilobject_;
      }
      pTVar7 = luaH_set(L,&((pTVar6->value).gc)->h,pTVar2 + -1);
      pTVar7->value = pTVar2->value;
      pTVar7->tt = pTVar2->tt;
      if ((3 < L->top[-1].tt) && ((((L->top[-1].value.gc)->gch).marked & 3) != 0)) {
        pGVar3 = (pTVar6->value).gc;
        if (((pGVar3->gch).marked & 4) != 0) {
          pgVar4 = L->l_G;
          (pGVar3->gch).marked = (pGVar3->gch).marked & 0xfb;
          (pGVar3->h).gclist = pgVar4->grayagain;
          pgVar4->grayagain = pGVar3;
        }
      }
      L->top = L->top + -2;
    }
    else {
      iVar5 = lua_getmetatable(L,iVar5);
      if (iVar5 == 0) {
LAB_00109a5e:
        luaL_argerror(L,1,"boolean or proxy expected");
      }
      pTVar2 = L->top;
      pGVar3 = (L->ci->func->value).gc;
      pTVar6 = (TValue *)&(pGVar3->h).lastfree;
      if ((pGVar3->h).lsizenode == '\0') {
        pTVar6 = &luaO_nilobject_;
      }
      pTVar7 = pTVar2 + -1;
      pTVar6 = luaH_get(&((pTVar6->value).gc)->h,pTVar7);
      pTVar2[-1].value = pTVar6->value;
      pTVar2[-1].tt = pTVar6->tt;
      pTVar1 = L->top;
      pTVar2 = pTVar1 + -1;
      if (pTVar1[-1].tt == 1) {
        iVar5 = pTVar1[-1].value.b;
        L->top = pTVar2;
        if (iVar5 == 0) goto LAB_00109a5e;
      }
      else {
        if (pTVar1[-1].tt == 0) {
          L->top = pTVar2;
          goto LAB_00109a5e;
        }
        L->top = pTVar2;
      }
      lua_getmetatable(L,(int)pTVar7);
    }
    lua_setmetatable(L,2);
  }
  return 1;
}

Assistant:

static int luaB_newproxy(lua_State*L){
lua_settop(L,1);
lua_newuserdata(L,0);
if(lua_toboolean(L,1)==0)
return 1;
else if(lua_isboolean(L,1)){
lua_newtable(L);
lua_pushvalue(L,-1);
lua_pushboolean(L,1);
lua_rawset(L,lua_upvalueindex(1));
}
else{
int validproxy=0;
if(lua_getmetatable(L,1)){
lua_rawget(L,lua_upvalueindex(1));
validproxy=lua_toboolean(L,-1);
lua_pop(L,1);
}
luaL_argcheck(L,validproxy,1,"boolean or proxy expected");
lua_getmetatable(L,1);
}
lua_setmetatable(L,2);
return 1;
}